

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortrclut_p.h
# Opt level: O0

QRgba64 __thiscall QColorTrcLut::toLinear64(QColorTrcLut *this,QRgb rgb32)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  type puVar6;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  int bidx;
  int gidx;
  int ridx;
  __m128i vidx;
  __m128i v;
  QRgba64 rgba64;
  size_t __i;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = (byte)in_ESI;
  uStack_97 = (undefined1)((uint)in_ESI >> 8);
  uStack_96 = (undefined1)((uint)in_ESI >> 0x10);
  uStack_95 = (undefined1)((uint)in_ESI >> 0x18);
  local_108._0_4_ = (uint)CONCAT12(uStack_97,(ushort)local_98);
  local_108._0_6_ = (uint6)CONCAT14(uStack_96,(uint)local_108);
  local_108 = CONCAT17(0,CONCAT16(uStack_95,(uint6)local_108));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_108;
  psllw(auVar4,ZEXT416(4));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_108;
  auVar7 = psllw(auVar7,ZEXT416(8));
  local_108 = auVar7._0_8_;
  uStack_100 = auVar7._8_8_;
  puVar6 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (uStack_100,local_108);
  uVar1 = *puVar6;
  __i = local_108;
  puVar6 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (uStack_100,local_108);
  uVar2 = *puVar6;
  puVar6 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (uStack_100,__i);
  uVar5 = (ushort)(local_108 >> 0x30);
  local_108._0_4_ = CONCAT22(uVar2 + (uVar2 >> 8),uVar1 + (uVar1 >> 8));
  local_108._0_6_ = CONCAT24(*puVar6 + (*puVar6 >> 8),(uint)local_108);
  local_108 = CONCAT26(uVar5 + (uVar5 >> 8),(uint6)local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (QRgba64)local_108;
  }
  __stack_chk_fail();
}

Assistant:

QRgba64 toLinear64(QRgb rgb32) const
    {
#if defined(__SSE2__)
        __m128i v = _mm_cvtsi32_si128(rgb32);
        v = _mm_unpacklo_epi8(v, _mm_setzero_si128());
        const __m128i vidx = _mm_slli_epi16(v, ShiftUp);
        const int ridx = _mm_extract_epi16(vidx, 2);
        const int gidx = _mm_extract_epi16(vidx, 1);
        const int bidx = _mm_extract_epi16(vidx, 0);
        v = _mm_slli_epi16(v, 8); // a * 256
        v = _mm_insert_epi16(v, m_toLinear[ridx], 0);
        v = _mm_insert_epi16(v, m_toLinear[gidx], 1);
        v = _mm_insert_epi16(v, m_toLinear[bidx], 2);
        v = _mm_add_epi16(v, _mm_srli_epi16(v, 8));
        QRgba64 rgba64;
        _mm_storel_epi64(reinterpret_cast<__m128i *>(&rgba64), v);
        return rgba64;
#elif defined(__ARM_NEON__) && Q_BYTE_ORDER == Q_LITTLE_ENDIAN
        uint8x8_t v8 = vreinterpret_u8_u32(vmov_n_u32(rgb32));
        uint16x4_t v16 = vget_low_u16(vmovl_u8(v8));
        const uint16x4_t vidx = vshl_n_u16(v16, ShiftUp);
        const int ridx = vget_lane_u16(vidx, 2);
        const int gidx = vget_lane_u16(vidx, 1);
        const int bidx = vget_lane_u16(vidx, 0);
        v16 = vshl_n_u16(v16, 8); // a * 256
        v16 = vset_lane_u16(m_toLinear[ridx], v16, 0);
        v16 = vset_lane_u16(m_toLinear[gidx], v16, 1);
        v16 = vset_lane_u16(m_toLinear[bidx], v16, 2);
        v16 = vadd_u16(v16, vshr_n_u16(v16, 8));
        return QRgba64::fromRgba64(vget_lane_u64(vreinterpret_u64_u16(v16), 0));
#else
        uint r = m_toLinear[qRed(rgb32) << ShiftUp];
        uint g = m_toLinear[qGreen(rgb32) << ShiftUp];
        uint b = m_toLinear[qBlue(rgb32) << ShiftUp];
        r = r + (r >> 8);
        g = g + (g >> 8);
        b = b + (b >> 8);
        return QRgba64::fromRgba64(r, g, b, qAlpha(rgb32) * 257);
#endif
    }